

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

void __thiscall
icu_63::anon_unknown_16::FCDUTF16NFDIterator::FCDUTF16NFDIterator
          (FCDUTF16NFDIterator *this,Normalizer2Impl *nfcImpl,UChar *text,UChar *textLimit)

{
  UChar *pUVar1;
  UBool UVar2;
  uint uVar3;
  int iVar4;
  int32_t iVar5;
  char16_t *pcVar6;
  undefined1 local_80 [8];
  ReorderingBuffer r_buffer;
  UChar *spanLimit;
  UErrorCode errorCode;
  UChar *local_28;
  UChar *textLimit_local;
  UChar *text_local;
  Normalizer2Impl *nfcImpl_local;
  FCDUTF16NFDIterator *this_local;
  
  local_28 = textLimit;
  textLimit_local = text;
  text_local = (UChar *)nfcImpl;
  nfcImpl_local = (Normalizer2Impl *)this;
  UTF16NFDIterator::UTF16NFDIterator(&this->super_UTF16NFDIterator,(UChar *)0x0,(UChar *)0x0);
  (this->super_UTF16NFDIterator).super_NFDIterator.super_UObject._vptr_UObject =
       (_func_int **)&PTR__FCDUTF16NFDIterator_004df320;
  UnicodeString::UnicodeString(&this->str);
  spanLimit._0_4_ = U_ZERO_ERROR;
  r_buffer.codePointLimit =
       Normalizer2Impl::makeFCD
                 ((Normalizer2Impl *)text_local,textLimit_local,local_28,(ReorderingBuffer *)0x0,
                  (UErrorCode *)&spanLimit);
  UVar2 = ::U_FAILURE((UErrorCode)spanLimit);
  if (UVar2 == '\0') {
    if ((r_buffer.codePointLimit == local_28) ||
       ((local_28 == (UChar *)0x0 && (*r_buffer.codePointLimit == L'\0')))) {
      (this->super_UTF16NFDIterator).s = textLimit_local;
      (this->super_UTF16NFDIterator).limit = r_buffer.codePointLimit;
    }
    else {
      UnicodeString::setTo
                (&this->str,textLimit_local,
                 (int32_t)((ulong)((long)r_buffer.codePointLimit - (long)textLimit_local) >> 1));
      ReorderingBuffer::ReorderingBuffer
                ((ReorderingBuffer *)local_80,(Normalizer2Impl *)text_local,&this->str);
      uVar3 = UnicodeString::length(&this->str);
      iVar4 = ReorderingBuffer::init((ReorderingBuffer *)local_80,(EVP_PKEY_CTX *)(ulong)uVar3);
      if ((char)iVar4 != '\0') {
        Normalizer2Impl::makeFCD
                  ((Normalizer2Impl *)text_local,r_buffer.codePointLimit,local_28,
                   (ReorderingBuffer *)local_80,(UErrorCode *)&spanLimit);
      }
      ReorderingBuffer::~ReorderingBuffer((ReorderingBuffer *)local_80);
      UVar2 = ::U_SUCCESS((UErrorCode)spanLimit);
      if (UVar2 != '\0') {
        pcVar6 = UnicodeString::getBuffer(&this->str);
        (this->super_UTF16NFDIterator).s = pcVar6;
        pUVar1 = (this->super_UTF16NFDIterator).s;
        iVar5 = UnicodeString::length(&this->str);
        (this->super_UTF16NFDIterator).limit = pUVar1 + iVar5;
      }
    }
  }
  return;
}

Assistant:

FCDUTF16NFDIterator(const Normalizer2Impl &nfcImpl, const UChar *text, const UChar *textLimit)
            : UTF16NFDIterator(NULL, NULL) {
        UErrorCode errorCode = U_ZERO_ERROR;
        const UChar *spanLimit = nfcImpl.makeFCD(text, textLimit, NULL, errorCode);
        if(U_FAILURE(errorCode)) { return; }
        if(spanLimit == textLimit || (textLimit == NULL && *spanLimit == 0)) {
            s = text;
            limit = spanLimit;
        } else {
            str.setTo(text, (int32_t)(spanLimit - text));
            {
                ReorderingBuffer r_buffer(nfcImpl, str);
                if(r_buffer.init(str.length(), errorCode)) {
                    nfcImpl.makeFCD(spanLimit, textLimit, &r_buffer, errorCode);
                }
            }
            if(U_SUCCESS(errorCode)) {
                s = str.getBuffer();
                limit = s + str.length();
            }
        }
    }